

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

ssize_t populate_binsettings(uint8_t *binsettings,Curl_easy *data)

{
  int iVar1;
  ssize_t sVar2;
  int ivlen;
  nghttp2_settings_entry iv [3];
  Curl_easy *data_local;
  uint8_t *binsettings_local;
  
  iVar1 = populate_settings((nghttp2_settings_entry *)&stack0xffffffffffffffc8,data);
  sVar2 = nghttp2_pack_settings_payload
                    (binsettings,0x50,(nghttp2_settings_entry *)&stack0xffffffffffffffc8,(long)iVar1
                    );
  return sVar2;
}

Assistant:

static ssize_t populate_binsettings(uint8_t *binsettings,
                                    struct Curl_easy *data)
{
  nghttp2_settings_entry iv[H2_SETTINGS_IV_LEN];
  int ivlen;

  ivlen = populate_settings(iv, data);
  /* this returns number of bytes it wrote or a negative number on error. */
  return nghttp2_pack_settings_payload(binsettings, H2_BINSETTINGS_LEN,
                                       iv, ivlen);
}